

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::pack(int arg_index,int argc,CVmDataSource *dst)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  ushort *puVar4;
  undefined4 extraout_var;
  err_id_t error_code;
  StackArgs args;
  CVmPackPos p;
  CVmPackGroup root;
  CVmPackArgs local_b0;
  CVmRun *local_a8;
  int local_a0;
  int local_9c;
  CVmPackPos local_98;
  CVmPackGroup local_80;
  
  puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + (-1 - (long)arg_index));
  if (puVar4 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  uVar1 = *puVar4;
  local_98.len = (size_t)uVar1;
  local_98.p.p_ = (char *)(puVar4 + 1);
  local_98.idx = 1;
  local_80.start.idx = 1;
  local_80.parent = (CVmPackGroup *)0x0;
  local_80.big_endian = 0;
  local_80.tilde = 0;
  local_80.pct = 0;
  local_80.start.p.p_ = local_98.p.p_;
  local_80.start.len = local_98.len;
  local_80.ds = dst;
  iVar3 = (*dst->_vptr_CVmDataSource[7])(dst);
  local_80.stream_ofs = CONCAT44(extraout_var,iVar3);
  local_80.cur_iter = 1;
  local_80.num_iters = 1;
  local_80.up_to_iters = 0;
  local_80.close_paren = L'\0';
  local_a0 = arg_index + 1;
  local_b0._vptr_CVmPackArgs = (_func_int **)&PTR_more_0036fd88;
  local_a8 = &G_interpreter_X;
  local_9c = arg_index + -1 + argc;
  pack_group(&local_98,&local_b0,&local_80,0);
  CVmPackPos::getch(&local_98);
  if (local_98.len == 0) {
    if (local_9c < local_a0) {
      return;
    }
    error_code = 0x6d;
    uVar2 = uVar1 + 1;
  }
  else {
    error_code = 0x6b;
    uVar2 = local_98.idx;
  }
  err_throw_a(error_code,1,0,(ulong)uVar2);
}

Assistant:

void CVmPack::pack(VMG_ int arg_index, int argc, CVmDataSource *dst)
{
    /* the first argument is the format string - retrieve it */
    const char *fmt = G_stk->get(arg_index)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* pack the root group */
    CVmPackPos p(fmt, fmtlen);
    CVmPackGroup root(&p, dst);
    StackArgs args(vmg_ arg_index + 1, argc - 1);
    pack_group(vmg_ &p, &args, &root, FALSE);

    /* make sure we exhausted the string */
    if (p.more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p.index());

    /* 
     *   if we didn't consume all of the arguments, it means that the format
     *   string didn't have enough entries for the supplied arguments - flag
     *   an error 
     */
    if (args.more())
        err_throw_a(VMERR_PACK_ARGC_MISMATCH, 1, ERR_TYPE_INT, (int)fmtlen+1);
}